

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

void duckdb_lz4::LZ4_clearHash(U32 h,void *tableBase,tableType_t tableType)

{
  U16 *hashTable_2;
  U32 *hashTable_1;
  BYTE **hashTable;
  tableType_t tableType_local;
  void *tableBase_local;
  U32 h_local;
  
  switch(tableType) {
  default:
    break;
  case byPtr:
    *(undefined8 *)((long)tableBase + (ulong)h * 8) = 0;
    break;
  case byU32:
    *(undefined4 *)((long)tableBase + (ulong)h * 4) = 0;
    break;
  case byU16:
    *(undefined2 *)((long)tableBase + (ulong)h * 2) = 0;
  }
  return;
}

Assistant:

LZ4_FORCE_INLINE void LZ4_clearHash(U32 h, void* tableBase, tableType_t const tableType)
{
    switch (tableType)
    {
    default: /* fallthrough */
    case clearedTable: { /* illegal! */ assert(0); return; }
    case byPtr: { const BYTE** hashTable = (const BYTE**)tableBase; hashTable[h] = NULL; return; }
    case byU32: { U32* hashTable = (U32*) tableBase; hashTable[h] = 0; return; }
    case byU16: { U16* hashTable = (U16*) tableBase; hashTable[h] = 0; return; }
    }
}